

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAcademicGeoMesh.cpp
# Opt level: O0

void __thiscall TPZAcademicGeoMesh::CheckConsistency(TPZAcademicGeoMesh *this,TPZGeoMesh *mesh)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  _func_int **pp_Var5;
  int iVar6;
  TPZGeoEl **ppTVar7;
  double *pdVar8;
  TPZGeoMesh *in_RSI;
  int i;
  int numtol;
  REAL xmax;
  REAL xmin;
  REAL tol;
  TPZManVector<double,_3> normal;
  TPZManVector<double,_3> x;
  REAL detjac;
  TPZFNMatrix<4,_double> jacinv;
  TPZFNMatrix<4,_double> jac;
  TPZFNMatrix<6,_double> axes;
  TPZManVector<double,_2> xi;
  TPZGeoElSide gelside;
  int is;
  int nsides;
  TPZGeoEl *gel;
  int64_t el;
  int64_t nel;
  TPZFMatrix<double> *in_stack_00000768;
  REAL *in_stack_00000770;
  TPZFMatrix<double> *in_stack_00000778;
  TPZFMatrix<double> *in_stack_00000780;
  TPZVec<double> *in_stack_00000788;
  TPZGeoElSide *in_stack_00000790;
  TPZManVector<double,_3> *in_stack_fffffffffffffb60;
  TPZGeoEl *in_stack_fffffffffffffb68;
  TPZGeoElSide *in_stack_fffffffffffffb70;
  double *in_stack_fffffffffffffb78;
  TPZFNMatrix<6,_double> *in_stack_fffffffffffffb80;
  double *in_stack_fffffffffffffb88;
  TPZManVector<double,_3> *in_stack_fffffffffffffb90;
  TPZVec<double> *in_stack_fffffffffffffbb0;
  TPZVec<double> *in_stack_fffffffffffffbb8;
  TPZGeoElSide *in_stack_fffffffffffffbc0;
  int local_380;
  int local_37c;
  TPZGeoEl *local_378;
  TPZFNMatrix<6,_double> *local_370;
  TPZVec<double> local_360;
  undefined8 local_328;
  TPZVec<double> local_320 [17];
  TPZVec<double> *in_stack_ffffffffffffff08;
  TPZGeoElSide *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  TPZGeoElSide local_70;
  undefined4 local_58;
  TPZGeoElSide local_48;
  int local_30;
  int local_2c;
  TPZGeoEl *local_28;
  long local_20;
  long local_18;
  TPZGeoMesh *local_10;
  
  local_10 = in_RSI;
  local_18 = TPZGeoMesh::NElements((TPZGeoMesh *)0x1e2e894);
  for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
    TPZGeoMesh::ElementVec(local_10);
    ppTVar7 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        ((TPZChunkVector<TPZGeoEl_*,_10> *)in_stack_fffffffffffffb80,
                         (int64_t)in_stack_fffffffffffffb78);
    local_28 = *ppTVar7;
    local_2c = (**(code **)(*(long *)local_28 + 0xf0))();
    for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
      TPZGeoElSide::TPZGeoElSide
                (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                 (int)((ulong)in_stack_fffffffffffffb60 >> 0x20));
      iVar6 = TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_fffffffffffffb60);
      if (iVar6 == 2) {
        TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffb68);
        iVar6 = TPZGeoElSide::operator!=(&local_70,&local_48);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e2e9ce);
        if (iVar6 == 0) {
          TPZManVector<double,_2>::TPZManVector
                    ((TPZManVector<double,_2> *)in_stack_fffffffffffffb90,
                     (int64_t)in_stack_fffffffffffffb88,(double *)in_stack_fffffffffffffb80);
          TPZGeoElSide::CenterPoint(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          TPZFNMatrix<6,_double>::TPZFNMatrix
                    (in_stack_fffffffffffffb80,(int64_t)in_stack_fffffffffffffb78,
                     (int64_t)in_stack_fffffffffffffb70);
          TPZFNMatrix<4,_double>::TPZFNMatrix
                    ((TPZFNMatrix<4,_double> *)in_stack_fffffffffffffb80,
                     (int64_t)in_stack_fffffffffffffb78,(int64_t)in_stack_fffffffffffffb70);
          TPZFNMatrix<4,_double>::TPZFNMatrix
                    ((TPZFNMatrix<4,_double> *)in_stack_fffffffffffffb80,
                     (int64_t)in_stack_fffffffffffffb78,(int64_t)in_stack_fffffffffffffb70);
          TPZGeoElSide::Jacobian
                    (in_stack_00000790,in_stack_00000788,in_stack_00000780,in_stack_00000778,
                     in_stack_00000770,in_stack_00000768);
          local_328 = 0;
          TPZManVector<double,_3>::TPZManVector
                    (in_stack_fffffffffffffb90,(int64_t)in_stack_fffffffffffffb88,
                     (double *)in_stack_fffffffffffffb80);
          TPZGeoElSide::X(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                          in_stack_fffffffffffffbb0);
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffffb80,
                     (int64_t)in_stack_fffffffffffffb78);
          pdVar8 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffffb80->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffffb78,(int64_t)in_stack_fffffffffffffb70)
          ;
          dVar1 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffffb80->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffffb78,(int64_t)in_stack_fffffffffffffb70)
          ;
          dVar2 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffffb80->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffffb78,(int64_t)in_stack_fffffffffffffb70)
          ;
          dVar3 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffffb80->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffffb78,(int64_t)in_stack_fffffffffffffb70)
          ;
          dVar4 = *pdVar8;
          pdVar8 = TPZVec<double>::operator[](&local_360,0);
          *pdVar8 = ABS(dVar1 * dVar2 - dVar3 * dVar4);
          pdVar8 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffffb80->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffffb78,(int64_t)in_stack_fffffffffffffb70)
          ;
          dVar1 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffffb80->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffffb78,(int64_t)in_stack_fffffffffffffb70)
          ;
          dVar2 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffffb80->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffffb78,(int64_t)in_stack_fffffffffffffb70)
          ;
          dVar3 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffffb80->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffffb78,(int64_t)in_stack_fffffffffffffb70)
          ;
          dVar4 = *pdVar8;
          pdVar8 = TPZVec<double>::operator[](&local_360,1);
          *pdVar8 = ABS(-dVar1 * dVar2 + dVar3 * dVar4);
          pdVar8 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffffb80->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffffb78,(int64_t)in_stack_fffffffffffffb70)
          ;
          in_stack_fffffffffffffbc0 = (TPZGeoElSide *)*pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffffb80->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffffb78,(int64_t)in_stack_fffffffffffffb70)
          ;
          in_stack_fffffffffffffbb0 = (TPZVec<double> *)*pdVar8;
          in_stack_fffffffffffffbb8 =
               (TPZVec<double> *)
               TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffb80->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffb78,(int64_t)in_stack_fffffffffffffb70);
          pp_Var5 = in_stack_fffffffffffffbb8->_vptr_TPZVec;
          pdVar8 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffffb80->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffffb78,(int64_t)in_stack_fffffffffffffb70)
          ;
          in_stack_fffffffffffffb90 =
               (TPZManVector<double,_3> *)
               ABS((double)in_stack_fffffffffffffbc0 * (double)in_stack_fffffffffffffbb0 -
                   (double)pp_Var5 * *pdVar8);
          pdVar8 = TPZVec<double>::operator[](&local_360,2);
          *pdVar8 = (double)in_stack_fffffffffffffb90;
          local_370 = (TPZFNMatrix<6,_double> *)0x3ff0000000000000;
          local_378 = (TPZGeoEl *)0x0;
          local_37c = 0;
          for (local_380 = 0; local_380 < 3; local_380 = local_380 + 1) {
            in_stack_fffffffffffffb80 = local_370;
            in_stack_fffffffffffffb88 = TPZVec<double>::operator[](local_320,(long)local_380);
            if (*in_stack_fffffffffffffb88 <= (double)in_stack_fffffffffffffb80 &&
                (double)in_stack_fffffffffffffb80 != *in_stack_fffffffffffffb88) {
              in_stack_fffffffffffffb78 = TPZVec<double>::operator[](local_320,(long)local_380);
              local_370 = (TPZFNMatrix<6,_double> *)*in_stack_fffffffffffffb78;
            }
            in_stack_fffffffffffffb68 = local_378;
            in_stack_fffffffffffffb70 =
                 (TPZGeoElSide *)TPZVec<double>::operator[](local_320,(long)local_380);
            if ((double)in_stack_fffffffffffffb68 <
                (double)(in_stack_fffffffffffffb70->super_TPZSavable)._vptr_TPZSavable) {
              in_stack_fffffffffffffb60 =
                   (TPZManVector<double,_3> *)TPZVec<double>::operator[](local_320,(long)local_380);
              local_378 = (TPZGeoEl *)(in_stack_fffffffffffffb60->super_TPZVec<double>)._vptr_TPZVec
              ;
            }
            pdVar8 = TPZVec<double>::operator[](&local_360,(long)local_380);
            if (1e-06 < *pdVar8) {
              local_37c = local_37c + 1;
            }
          }
          if (local_37c != 1) {
            pzinternal::DebugStopImpl(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          }
          if ((1e-06 < (double)local_370) && ((double)local_378 < 0.999999)) {
            pzinternal::DebugStopImpl(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          }
          TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffb60);
          TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffb60);
          TPZFNMatrix<4,_double>::~TPZFNMatrix((TPZFNMatrix<4,_double> *)0x1e2f159);
          TPZFNMatrix<4,_double>::~TPZFNMatrix((TPZFNMatrix<4,_double> *)0x1e2f166);
          TPZFNMatrix<6,_double>::~TPZFNMatrix((TPZFNMatrix<6,_double> *)0x1e2f173);
          TPZManVector<double,_2>::~TPZManVector
                    ((TPZManVector<double,_2> *)in_stack_fffffffffffffb60);
          local_58 = 0;
        }
        else {
          local_58 = 7;
        }
      }
      else {
        local_58 = 7;
      }
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e2f198);
    }
  }
  return;
}

Assistant:

void TPZAcademicGeoMesh::CheckConsistency(TPZGeoMesh *mesh)
{
    int64_t nel = mesh->NElements();
    for(int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = mesh->ElementVec()[el];
        int nsides = gel->NSides();
        for(int is=0; is<nsides; is++) {
            TPZGeoElSide gelside(gel,is);
            if(gelside.Dimension() != 2) {
                continue;
            }
            if(gelside.Neighbour() != gelside) {
                continue;
            }
            TPZManVector<REAL,2> xi(2,0.);
            gelside.CenterPoint(xi);
            TPZFNMatrix<6,REAL> axes(2,3);
            TPZFNMatrix<4,REAL> jac(2,2),jacinv(2,2);
            REAL detjac;
            gelside.Jacobian(xi, jac, axes, detjac, jacinv);
            TPZManVector<REAL,3> x(3,0.);
            gelside.X(xi, x);
            TPZManVector<REAL,3> normal(3);
            normal[0] = fabs(axes(0,1)*axes(1,2)-axes(0,2)*axes(1,1));
            normal[1] = fabs(-axes(0,0)*axes(1,2)+axes(0,2)*axes(1,0));
            normal[2] = fabs(axes(0,0)*axes(1,1)-axes(0,1)*axes(1,0));
            REAL tol = 1.e-6;
            REAL xmin = 1., xmax = 0.;
            int numtol = 0;
            for(int i=0; i<3; i++) {
                if(xmin > x[i]) xmin = x[i];
                if(xmax < x[i]) {
                    xmax = x[i];
                }
                if(normal[i] > tol) {
                    numtol++;
                }
            }
            if(numtol != 1) {
                DebugStop();
            }
            if(xmin > tol && xmax < 1.-tol) {
                DebugStop();
            }
        }
    }
}